

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_> *
ctemplate::GetModifierForCss
          (vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           *__return_storage_ptr__,HtmlParser *htmlparser,string *error_msg)

{
  (__return_storage_ptr__->
  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ctemplate::ModifierAndValue_const*,std::allocator<ctemplate::ModifierAndValue_const*>>
  ::_M_realloc_insert<ctemplate::ModifierAndValue_const*const&>
            ((vector<ctemplate::ModifierAndValue_const*,std::allocator<ctemplate::ModifierAndValue_const*>>
              *)__return_storage_ptr__,(iterator)0x0,(ModifierAndValue **)(g_am_dirs + 0x38));
  return __return_storage_ptr__;
}

Assistant:

vector<const ModifierAndValue*> GetModifierForCss(HtmlParser* htmlparser,
                                                  string* error_msg) {
  vector<const ModifierAndValue*> modvals;
  modvals.push_back(g_am_dirs[AM_STYLE]);
  return modvals;
}